

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockExpectedCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockNamedValueHandlerRepository_installMultipleCopiers_TestShell::createTest
          (TEST_MockNamedValueHandlerRepository_installMultipleCopiers_TestShell *this)

{
  Utest *this_00;
  TEST_MockNamedValueHandlerRepository_installMultipleCopiers_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockExpectedCallTest.cpp"
                                  ,0x7b);
  TEST_MockNamedValueHandlerRepository_installMultipleCopiers_Test::
  TEST_MockNamedValueHandlerRepository_installMultipleCopiers_Test
            ((TEST_MockNamedValueHandlerRepository_installMultipleCopiers_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockNamedValueHandlerRepository, installMultipleCopiers)
{
    TypeForTestingExpectedFunctionCallCopier copier1, copier2, copier3;
    MockNamedValueComparatorsAndCopiersRepository repository;
    repository.installCopier("type1", copier1);
    repository.installCopier("type2", copier2);
    repository.installCopier("type3", copier3);
    POINTERS_EQUAL(&copier3, repository.getCopierForType("type3"));
    POINTERS_EQUAL(&copier2, repository.getCopierForType("type2"));
    POINTERS_EQUAL(&copier1, repository.getCopierForType("type1"));
}